

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

ssize_t zisofs_extract_init(archive_write *a,zisofs_extract *zisofs,uchar *p,size_t bytes)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  uchar *puVar4;
  int err;
  size_t alloc;
  size_t xsize;
  size_t _ceil;
  size_t avail;
  size_t bytes_local;
  uchar *p_local;
  zisofs_extract *zisofs_local;
  archive_write *a_local;
  
  uVar3 = (((zisofs->pz_uncompressed_size + (1L << ((byte)zisofs->pz_log2_bs & 0x3f))) - 1 >>
           ((byte)zisofs->pz_log2_bs & 0x3f)) + 1) * 4;
  if (zisofs->block_pointers == (uchar *)0x0) {
    puVar4 = (uchar *)malloc(((uVar3 >> 10) + 1) * 0x400);
    zisofs->block_pointers = puVar4;
    if (zisofs->block_pointers == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"No memory for zisofs decompression");
      return -0x1e;
    }
  }
  zisofs->block_pointers_size = uVar3;
  zisofs->uncompressed_buffer_size = 1L << ((byte)zisofs->pz_log2_bs & 0x3f);
  _ceil = bytes;
  bytes_local = (size_t)p;
  if (((byte)zisofs->field_0x18 >> 1 & 1) == 0) {
    bVar1 = false;
    if (bytes < 0x10) {
      archive_set_error(&a->archive,0x54,"Illegal zisofs file body");
      return -0x1e;
    }
    if (*(long *)p == 0x7d6dbc99653e437) {
      uVar2 = archive_le32dec(p + 8);
      if ((ulong)uVar2 == zisofs->pz_uncompressed_size) {
        if ((p[0xc] != '\x04') || ((uint)p[0xd] != zisofs->pz_log2_bs)) {
          bVar1 = true;
        }
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
    }
    if (bVar1) {
      archive_set_error(&a->archive,0x54,"Illegal zisofs file body");
      return -0x1e;
    }
    _ceil = bytes - 0x10;
    bytes_local = (size_t)(p + 0x10);
    zisofs->field_0x18 = zisofs->field_0x18 & 0xfd | 2;
  }
  if ((((byte)zisofs->field_0x18 >> 1 & 1) != 0) &&
     (zisofs->block_pointers_avail < zisofs->block_pointers_size)) {
    alloc = zisofs->block_pointers_size - zisofs->block_pointers_avail;
    if (_ceil < alloc) {
      alloc = _ceil;
    }
    memcpy(zisofs->block_pointers + zisofs->block_pointers_avail,(void *)bytes_local,alloc);
    zisofs->block_pointers_avail = alloc + zisofs->block_pointers_avail;
    _ceil = _ceil - alloc;
    if (zisofs->block_pointers_avail == zisofs->block_pointers_size) {
      zisofs->block_off = 0;
      zisofs->block_avail = 0;
      zisofs->field_0x18 = zisofs->field_0x18 & 0xfe | 1;
    }
  }
  return _ceil;
}

Assistant:

static ssize_t
zisofs_extract_init(struct archive_write *a, struct zisofs_extract *zisofs,
    const unsigned char *p, size_t bytes)
{
	size_t avail = bytes;
	size_t _ceil, xsize;

	/* Allocate block pointers buffer. */
	_ceil = (size_t)((zisofs->pz_uncompressed_size +
		(((int64_t)1) << zisofs->pz_log2_bs) - 1)
		>> zisofs->pz_log2_bs);
	xsize = (_ceil + 1) * 4;
	if (zisofs->block_pointers == NULL) {
		size_t alloc = ((xsize >> 10) + 1) << 10;
		zisofs->block_pointers = malloc(alloc);
		if (zisofs->block_pointers == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for zisofs decompression");
			return (ARCHIVE_FATAL);
		}
	}
	zisofs->block_pointers_size = xsize;

	/* Allocate uncompressed data buffer. */
	zisofs->uncompressed_buffer_size = (size_t)1UL << zisofs->pz_log2_bs;

	/*
	 * Read the file header, and check the magic code of zisofs.
	 */
	if (!zisofs->header_passed) {
		int err = 0;
		if (avail < 16) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs file body");
			return (ARCHIVE_FATAL);
		}

		if (memcmp(p, zisofs_magic, sizeof(zisofs_magic)) != 0)
			err = 1;
		else if (archive_le32dec(p + 8) != zisofs->pz_uncompressed_size)
			err = 1;
		else if (p[12] != 4 || p[13] != zisofs->pz_log2_bs)
			err = 1;
		if (err) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs file body");
			return (ARCHIVE_FATAL);
		}
		avail -= 16;
		p += 16;
		zisofs->header_passed = 1;
	}

	/*
	 * Read block pointers.
	 */
	if (zisofs->header_passed &&
	    zisofs->block_pointers_avail < zisofs->block_pointers_size) {
		xsize = zisofs->block_pointers_size
		    - zisofs->block_pointers_avail;
		if (avail < xsize)
			xsize = avail;
		memcpy(zisofs->block_pointers
		    + zisofs->block_pointers_avail, p, xsize);
		zisofs->block_pointers_avail += xsize;
		avail -= xsize;
	    	if (zisofs->block_pointers_avail
		    == zisofs->block_pointers_size) {
			/* We've got all block pointers and initialize
			 * related variables.	*/
			zisofs->block_off = 0;
			zisofs->block_avail = 0;
			/* Complete a initialization */
			zisofs->initialized = 1;
		}
	}
	return ((ssize_t)avail);
}